

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

RowSetEntry * rowSetEntrySort(RowSetEntry *pIn)

{
  RowSetEntry *pRVar1;
  RowSetEntry *pRVar2;
  long lVar3;
  ulong uVar4;
  RowSetEntry **ppRVar5;
  long in_FS_OFFSET;
  RowSetEntry *aBucket [40];
  RowSetEntry *local_178;
  long local_170 [40];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_178,0xaa,0x140);
  memset(&local_178,0,0x140);
  if (pIn != (RowSetEntry *)0x0) {
    do {
      pRVar1 = pIn->pRight;
      pIn->pRight = (RowSetEntry *)0x0;
      ppRVar5 = &local_178;
      if (local_178 != (RowSetEntry *)0x0) {
        uVar4 = 1;
        pRVar2 = local_178;
        ppRVar5 = &local_178;
        do {
          pIn = rowSetEntryMerge(pRVar2,pIn);
          *ppRVar5 = (RowSetEntry *)0x0;
          ppRVar5 = (RowSetEntry **)(local_170 + (uVar4 - 1));
          pRVar2 = *ppRVar5;
          uVar4 = (ulong)((int)uVar4 + 1);
        } while (pRVar2 != (RowSetEntry *)0x0);
      }
      *ppRVar5 = pIn;
      pIn = pRVar1;
    } while (pRVar1 != (RowSetEntry *)0x0);
  }
  lVar3 = 1;
  do {
    pRVar1 = (RowSetEntry *)local_170[lVar3 + -1];
    pRVar2 = local_178;
    if ((pRVar1 != (RowSetEntry *)0x0) && (pRVar2 = pRVar1, local_178 != (RowSetEntry *)0x0)) {
      pRVar2 = rowSetEntryMerge(local_178,pRVar1);
    }
    lVar3 = lVar3 + 1;
    local_178 = pRVar2;
  } while (lVar3 != 0x28);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return pRVar2;
}

Assistant:

static struct RowSetEntry *rowSetEntrySort(struct RowSetEntry *pIn){
  unsigned int i;
  struct RowSetEntry *pNext, *aBucket[40];

  memset(aBucket, 0, sizeof(aBucket));
  while( pIn ){
    pNext = pIn->pRight;
    pIn->pRight = 0;
    for(i=0; aBucket[i]; i++){
      pIn = rowSetEntryMerge(aBucket[i], pIn);
      aBucket[i] = 0;
    }
    aBucket[i] = pIn;
    pIn = pNext;
  }
  pIn = aBucket[0];
  for(i=1; i<sizeof(aBucket)/sizeof(aBucket[0]); i++){
    if( aBucket[i]==0 ) continue;
    pIn = pIn ? rowSetEntryMerge(pIn, aBucket[i]) : aBucket[i];
  }
  return pIn;
}